

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char.c++
# Opt level: O2

double __thiscall
kj::parse::_::ParseFloat::operator()
          (ParseFloat *this,Array<char> *digits,Maybe<kj::Array<char>_> *fraction,
          Maybe<kj::_::Tuple<kj::Maybe<char>,_kj::Array<char>_>_> *exponent)

{
  char *__nptr;
  size_t __n;
  char *pcVar1;
  size_t sVar2;
  ulong count;
  Array<char> buf_heap;
  char buf_stack [128];
  Array<char> local_c8;
  double local_b0;
  char local_a8 [128];
  
  __n = digits->size_;
  sVar2 = __n + (fraction->ptr).field_1.value.size_ + 1;
  if ((fraction->ptr).isSet == false) {
    sVar2 = __n;
  }
  if ((exponent->ptr).isSet == true) {
    sVar2 = sVar2 + *(long *)((long)&(exponent->ptr).field_1 + 0x10) +
            (ulong)(exponent->ptr).field_1.value.impl.super_TupleElement<0U,_kj::Maybe<char>_>.value
                   .ptr.isSet + 1;
  }
  count = sVar2 + 1;
  if (count < 0x81) {
    local_c8.ptr = (char *)0x0;
    local_c8.size_ = 0;
    local_c8.disposer = (ArrayDisposer *)0x0;
    __nptr = local_a8;
  }
  else {
    __nptr = kj::_::HeapArrayDisposer::allocate<char>(count);
    local_c8.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    __n = digits->size_;
    local_c8.ptr = __nptr;
    local_c8.size_ = count;
  }
  memcpy(__nptr,digits->ptr,__n);
  pcVar1 = __nptr + digits->size_;
  if ((fraction->ptr).isSet == true) {
    *pcVar1 = '.';
    memcpy(pcVar1 + 1,(fraction->ptr).field_1.value.ptr,(fraction->ptr).field_1.value.size_);
    pcVar1 = pcVar1 + 1 + (fraction->ptr).field_1.value.size_;
  }
  if ((exponent->ptr).isSet == true) {
    *pcVar1 = 'e';
    if ((exponent->ptr).field_1.value.impl.super_TupleElement<0U,_kj::Maybe<char>_>.value.ptr.isSet
        == true) {
      *(anon_union_1_1_a8c68091_for_NullableValue<char>_2 *)(pcVar1 + 1) =
           (exponent->ptr).field_1.value.impl.super_TupleElement<0U,_kj::Maybe<char>_>.value.ptr.
           field_1;
      pcVar1 = pcVar1 + 2;
    }
    else {
      pcVar1 = pcVar1 + 1;
    }
    memcpy(pcVar1,*(void **)((long)&(exponent->ptr).field_1 + 8),
           *(size_t *)((long)&(exponent->ptr).field_1 + 0x10));
    pcVar1 = pcVar1 + *(long *)((long)&(exponent->ptr).field_1 + 0x10);
  }
  *pcVar1 = '\0';
  local_b0 = strtod(__nptr,(char **)0x0);
  Array<char>::~Array(&local_c8);
  return local_b0;
}

Assistant:

double ParseFloat::operator()(const Array<char>& digits,
                              const Maybe<Array<char>>& fraction,
                              const Maybe<Tuple<Maybe<char>, Array<char>>>& exponent) const {
  size_t bufSize = digits.size();
  KJ_IF_MAYBE(f, fraction) {
    bufSize += 1 + f->size();
  }
  KJ_IF_MAYBE(e, exponent) {
    bufSize += 1 + (get<0>(*e) != nullptr) + get<1>(*e).size();
  }

  KJ_STACK_ARRAY(char, buf, bufSize + 1, 128, 128);

  char* pos = buf.begin();
  memcpy(pos, digits.begin(), digits.size());
  pos += digits.size();
  KJ_IF_MAYBE(f, fraction) {
    *pos++ = '.';
    memcpy(pos, f->begin(), f->size());
    pos += f->size();
  }
  KJ_IF_MAYBE(e, exponent) {
    *pos++ = 'e';
    KJ_IF_MAYBE(sign, get<0>(*e)) {
      *pos++ = *sign;
    }
    memcpy(pos, get<1>(*e).begin(), get<1>(*e).size());
    pos += get<1>(*e).size();
  }

  *pos++ = '\0';
  KJ_DASSERT(pos == buf.end());

  return strtod(buf.begin(), nullptr);
}